

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

void __thiscall NodeFS::NodeFS(NodeFS *this)

{
  NodeFS *this_local;
  
  this->_vptr_NodeFS = (_func_int **)&PTR__NodeFS_002c21d8;
  std::__cxx11::string::string((string *)&this->name_);
  std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::vector(&this->sub_node_);
  this->offset_ = 0;
  this->buffer_ = (uchar *)0x0;
  this->type_ = -1;
  return;
}

Assistant:

NodeFS::NodeFS() : buffer_(nullptr), offset_(0), type_(-1)
{
}